

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O3

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
::visit_key(json_visitor_adaptor<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
            *this,string_view_type *name,ser_context *context,error_code *ec)

{
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *pbVar1;
  type tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_28;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tVar2 = unicode_traits::convert<wchar_t,std::__cxx11::string>
                    (name->_M_str,name->_M_len,&local_50,strict);
  if (tVar2.ec != success) {
    std::error_code::operator=(ec,tVar2.ec);
  }
  pbVar1 = (this->
           super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>_>
           ).destination1_;
  local_30 = local_50._M_string_length;
  local_28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_50._M_dataplus._M_p;
  (*(pbVar1->super_basic_json_visitor<char>)._vptr_basic_json_visitor[9])
            (pbVar1,&local_30,context,ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(name.data(), name.size(), target, unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            ec = result.ec;
        }
        return destination().key(target, context, ec);
    }